

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTotalsDivider(ConsoleReporter *this,Totals *totals)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  sVar1 = (totals->testCases).passed;
  uVar10 = (totals->testCases).failed + sVar1 + (totals->testCases).failedButOk;
  if (uVar10 == 0) {
    poVar4 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    Colour::use(BrightYellow);
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,'O');
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    Colour::use(None);
  }
  else {
    sVar2 = (totals->testCases).failed;
    sVar3 = (totals->testCases).failedButOk;
    uVar7 = sVar2 * 0x50;
    uVar5 = uVar7 / uVar10;
    uVar8 = uVar5;
    if (uVar7 < uVar10) {
      uVar8 = 1;
    }
    if (sVar2 == 0) {
      uVar8 = uVar5;
    }
    uVar7 = sVar3 * 0x50;
    uVar6 = uVar7 / uVar10;
    uVar5 = uVar6;
    if (uVar7 < uVar10) {
      uVar5 = 1;
    }
    if (sVar3 == 0) {
      uVar5 = uVar6;
    }
    uVar6 = (sVar1 * 0x50) / uVar10;
    uVar7 = 1;
    if (uVar10 <= sVar1 * 0x50) {
      uVar7 = uVar6;
    }
    if (sVar1 == 0) {
      uVar7 = uVar6;
    }
    uVar10 = uVar5 + uVar8 + uVar7;
    while (uVar10 < 0x4f) {
      uVar6 = uVar7;
      if (uVar7 < uVar5) {
        uVar6 = uVar5;
      }
      if (uVar5 < uVar8 && uVar7 < uVar8) {
        uVar6 = uVar8;
      }
      uVar6 = uVar6 + 1;
      uVar9 = uVar6;
      uVar10 = uVar5;
      if (uVar7 < uVar5) {
        uVar9 = uVar7;
        uVar10 = uVar6;
      }
      if (uVar5 >= uVar8 || uVar7 >= uVar8) {
        uVar6 = uVar8;
        uVar5 = uVar10;
        uVar7 = uVar9;
      }
      uVar8 = uVar6;
      uVar10 = uVar5 + uVar6 + uVar7;
    }
    uVar10 = uVar5 + uVar8 + uVar7;
    while (0x4f < uVar10) {
      uVar10 = uVar7;
      if (uVar7 < uVar5) {
        uVar10 = uVar5;
      }
      if (uVar5 < uVar8 && uVar7 < uVar8) {
        uVar10 = uVar8;
      }
      uVar10 = uVar10 - 1;
      uVar9 = uVar10;
      uVar6 = uVar5;
      if (uVar7 < uVar5) {
        uVar9 = uVar7;
        uVar6 = uVar10;
      }
      if (uVar5 < uVar8 && uVar7 < uVar8) {
        uVar8 = uVar10;
        uVar6 = uVar5;
        uVar9 = uVar7;
      }
      uVar5 = uVar6;
      uVar7 = uVar9;
      uVar10 = uVar6 + uVar8 + uVar9;
    }
    poVar4 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    Colour::use(BrightRed);
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    Colour::use(None);
    poVar4 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    Colour::use(BrightYellow);
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    Colour::use(None);
    poVar4 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
    if ((totals->testCases).failedButOk == 0 && (totals->testCases).failed == 0) {
      Colour::use(BrightGreen);
      local_50 = local_40;
      std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      Colour::use(None);
    }
    else {
      Colour::use(Green);
      local_50 = local_40;
      std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      Colour::use(None);
    }
  }
  local_50 = (char *)CONCAT71(local_50._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
             (char *)&local_50,1);
  return;
}

Assistant:

void ConsoleReporter::printTotalsDivider(Totals const& totals) {
    if (totals.testCases.total() > 0) {
        std::size_t failedRatio = makeRatio(totals.testCases.failed, totals.testCases.total());
        std::size_t failedButOkRatio = makeRatio(totals.testCases.failedButOk, totals.testCases.total());
        std::size_t passedRatio = makeRatio(totals.testCases.passed, totals.testCases.total());
        while (failedRatio + failedButOkRatio + passedRatio < CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio)++;
        while (failedRatio + failedButOkRatio + passedRatio > CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio)--;

        stream << Colour(Colour::Error) << std::string(failedRatio, '=');
        stream << Colour(Colour::ResultExpectedFailure) << std::string(failedButOkRatio, '=');
        if (totals.testCases.allPassed())
            stream << Colour(Colour::ResultSuccess) << std::string(passedRatio, '=');
        else
            stream << Colour(Colour::Success) << std::string(passedRatio, '=');
    } else {
        stream << Colour(Colour::Warning) << std::string(CATCH_CONFIG_CONSOLE_WIDTH - 1, '=');
    }
    stream << '\n';
}